

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001735f0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001735f7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001735e0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001735e8 = 0x2d2d2d2d2d2d2d;
    DAT_001735ef = 0x2d;
    _DAT_001735d0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001735d8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001735c0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001735c8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001735b8 = 0x2d2d2d2d2d2d2d2d;
    DAT_001735ff = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }